

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_write1(BGZF *fp,bam1_t *b)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  int iVar30;
  ssize_t sVar31;
  long lVar32;
  byte bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint32_t block_len;
  uint32_t y;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  uVar1 = b->l_data + 0x20;
  local_48._0_4_ = (b->core).tid;
  local_48._4_4_ = (b->core).pos;
  uVar3 = *(undefined8 *)&(b->core).field_0x8;
  local_40 = (uint)((ulong)uVar3 >> 0x18) & 0xff |
             (uint)((ulong)uVar3 >> 8) & 0xff00 | (int)uVar3 << 0x10;
  local_3c = (uint)(ushort)((ulong)uVar3 >> 0x30) | (uint)((ulong)uVar3 >> 0x10) & 0xffff0000;
  local_38._0_4_ = (b->core).l_qseq;
  local_38._4_4_ = (b->core).mtid;
  uStack_30._0_4_ = (b->core).mpos;
  uStack_30._4_4_ = (b->core).isize;
  local_50 = uVar1;
  iVar30 = bgzf_flush_try(fp,(ulong)(b->l_data + 0x24));
  if ((fp->field_0x2 & 0xc) == 0) {
    if (iVar30 < 0) {
      bVar33 = 1;
      goto LAB_00139050;
    }
    sVar31 = bgzf_write(fp,&local_50,4);
    bVar34 = -1 < sVar31;
  }
  else {
    lVar32 = 0;
    do {
      auVar35 = *(undefined1 (*) [16])((long)&local_48 + lVar32 * 4);
      auVar36[1] = 0;
      auVar36[0] = auVar35[8];
      auVar36[2] = auVar35[9];
      auVar36[3] = 0;
      auVar36[4] = auVar35[10];
      auVar36[5] = 0;
      auVar36[6] = auVar35[0xb];
      auVar36[7] = 0;
      auVar36[8] = auVar35[0xc];
      auVar36[9] = 0;
      auVar36[10] = auVar35[0xd];
      auVar36[0xb] = 0;
      auVar36[0xc] = auVar35[0xe];
      auVar36[0xd] = 0;
      auVar36[0xe] = auVar35[0xf];
      auVar36[0xf] = 0;
      auVar36 = pshuflw(auVar36,auVar36,0x1b);
      auVar36 = pshufhw(auVar36,auVar36,0x1b);
      auVar20[0xd] = 0;
      auVar20._0_13_ = auVar35._0_13_;
      auVar20[0xe] = auVar35[7];
      auVar21[0xc] = auVar35[6];
      auVar21._0_12_ = auVar35._0_12_;
      auVar21._13_2_ = auVar20._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar35._0_11_;
      auVar22._12_3_ = auVar21._12_3_;
      auVar23[10] = auVar35[5];
      auVar23._0_10_ = auVar35._0_10_;
      auVar23._11_4_ = auVar22._11_4_;
      auVar24[9] = 0;
      auVar24._0_9_ = auVar35._0_9_;
      auVar24._10_5_ = auVar23._10_5_;
      auVar25[8] = auVar35[4];
      auVar25._0_8_ = auVar35._0_8_;
      auVar25._9_6_ = auVar24._9_6_;
      auVar27._7_8_ = 0;
      auVar27._0_7_ = auVar25._8_7_;
      auVar28._1_8_ = SUB158(auVar27 << 0x40,7);
      auVar28[0] = auVar35[3];
      auVar28._9_6_ = 0;
      auVar29._1_10_ = SUB1510(auVar28 << 0x30,5);
      auVar29[0] = auVar35[2];
      auVar29._11_4_ = 0;
      auVar26[2] = auVar35[1];
      auVar26._0_2_ = auVar35._0_2_;
      auVar26._3_12_ = SUB1512(auVar29 << 0x20,3);
      auVar35._0_2_ = auVar35._0_2_ & 0xff;
      auVar35._2_13_ = auVar26._2_13_;
      auVar35[0xf] = 0;
      auVar35 = pshuflw(auVar35,auVar35,0x1b);
      auVar35 = pshufhw(auVar35,auVar35,0x1b);
      sVar4 = auVar35._0_2_;
      sVar5 = auVar35._2_2_;
      sVar6 = auVar35._4_2_;
      sVar7 = auVar35._6_2_;
      sVar8 = auVar35._8_2_;
      sVar9 = auVar35._10_2_;
      sVar10 = auVar35._12_2_;
      sVar11 = auVar35._14_2_;
      sVar12 = auVar36._0_2_;
      sVar13 = auVar36._2_2_;
      sVar14 = auVar36._4_2_;
      sVar15 = auVar36._6_2_;
      sVar16 = auVar36._8_2_;
      sVar17 = auVar36._10_2_;
      sVar18 = auVar36._12_2_;
      sVar19 = auVar36._14_2_;
      lVar2 = lVar32 * 4;
      *(char *)((long)&local_48 + lVar2) =
           (0 < sVar4) * (sVar4 < 0x100) * auVar35[0] - (0xff < sVar4);
      *(char *)((long)&local_48 + lVar2 + 1) =
           (0 < sVar5) * (sVar5 < 0x100) * auVar35[2] - (0xff < sVar5);
      *(char *)((long)&local_48 + lVar2 + 2) =
           (0 < sVar6) * (sVar6 < 0x100) * auVar35[4] - (0xff < sVar6);
      *(char *)((long)&local_48 + lVar2 + 3) =
           (0 < sVar7) * (sVar7 < 0x100) * auVar35[6] - (0xff < sVar7);
      *(char *)((long)&local_48 + lVar2 + 4) =
           (0 < sVar8) * (sVar8 < 0x100) * auVar35[8] - (0xff < sVar8);
      *(char *)((long)&local_48 + lVar2 + 5) =
           (0 < sVar9) * (sVar9 < 0x100) * auVar35[10] - (0xff < sVar9);
      *(char *)((long)&local_48 + lVar2 + 6) =
           (0 < sVar10) * (sVar10 < 0x100) * auVar35[0xc] - (0xff < sVar10);
      *(char *)((long)&local_48 + lVar2 + 7) =
           (0 < sVar11) * (sVar11 < 0x100) * auVar35[0xe] - (0xff < sVar11);
      *(char *)(&local_40 + lVar32) = (0 < sVar12) * (sVar12 < 0x100) * auVar36[0] - (0xff < sVar12)
      ;
      *(char *)((long)&local_40 + lVar2 + 1) =
           (0 < sVar13) * (sVar13 < 0x100) * auVar36[2] - (0xff < sVar13);
      *(char *)((long)&local_40 + lVar2 + 2) =
           (0 < sVar14) * (sVar14 < 0x100) * auVar36[4] - (0xff < sVar14);
      *(char *)((long)&local_40 + lVar2 + 3) =
           (0 < sVar15) * (sVar15 < 0x100) * auVar36[6] - (0xff < sVar15);
      *(char *)(&local_3c + lVar32) = (0 < sVar16) * (sVar16 < 0x100) * auVar36[8] - (0xff < sVar16)
      ;
      *(char *)((long)&local_3c + lVar2 + 1) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar36[10] - (0xff < sVar17);
      *(char *)((long)&local_3c + lVar2 + 2) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar36[0xc] - (0xff < sVar18);
      *(char *)((long)&local_3c + lVar2 + 3) =
           (0 < sVar19) * (sVar19 < 0x100) * auVar36[0xe] - (0xff < sVar19);
      lVar32 = lVar32 + 4;
    } while (lVar32 != 8);
    if (iVar30 < 0) {
      bVar34 = false;
      local_4c = uVar1;
    }
    else {
      local_4c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 * 0x1000000
      ;
      sVar31 = bgzf_write(fp,&local_4c,4);
      bVar34 = -1 < sVar31;
    }
    swap_data(&b->core,b->l_data,b->data,1);
  }
  bVar33 = 1;
  if (bVar34) {
    sVar31 = bgzf_write(fp,&local_48,0x20);
    if (-1 < sVar31) {
      sVar31 = bgzf_write(fp,b->data,(long)b->l_data);
      bVar33 = (byte)((ulong)sVar31 >> 0x3f);
    }
  }
LAB_00139050:
  if ((fp->field_0x2 & 0xc) != 0) {
    swap_data(&b->core,b->l_data,b->data,0);
  }
  iVar30 = -1;
  if (bVar33 == 0) {
    iVar30 = local_50 + 4;
  }
  return iVar30;
}

Assistant:

int bam_write1(BGZF *fp, const bam1_t *b)
{
    const bam1_core_t *c = &b->core;
    uint32_t x[8], block_len = b->l_data + 32, y;
    int i, ok;
    x[0] = c->tid;
    x[1] = c->pos;
    x[2] = (uint32_t)c->bin<<16 | c->qual<<8 | c->l_qname;
    x[3] = (uint32_t)c->flag<<16 | c->n_cigar;
    x[4] = c->l_qseq;
    x[5] = c->mtid;
    x[6] = c->mpos;
    x[7] = c->isize;
    ok = (bgzf_flush_try(fp, 4 + block_len) >= 0);
    if (fp->is_be) {
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
        y = block_len;
        if (ok) ok = (bgzf_write(fp, ed_swap_4p(&y), 4) >= 0);
        swap_data(c, b->l_data, b->data, 1);
    } else {
        if (ok) ok = (bgzf_write(fp, &block_len, 4) >= 0);
    }
    if (ok) ok = (bgzf_write(fp, x, 32) >= 0);
    if (ok) ok = (bgzf_write(fp, b->data, b->l_data) >= 0);
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return ok? 4 + block_len : -1;
}